

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O3

bool __thiscall
double_conversion::FastFixedDtoa
          (double_conversion *this,double v,int fractional_count,Vector<char> buffer,int *length,
          int *decimal_point)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 in_EAX;
  uint64_t d64;
  char *pcVar3;
  long lVar4;
  byte bVar5;
  uint *puVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  int *decimal_point_00;
  ulong uVar11;
  
  buffer_00.start_ = (char *)CONCAT44(in_register_00000034,fractional_count);
  puVar6 = buffer._8_8_;
  bVar16 = ((ulong)v & 0x7ff0000000000000) == 0;
  uVar15 = ((ulong)v & 0xfffffffffffff) + 0x10000000000000;
  if (bVar16) {
    uVar15 = (ulong)v & 0xfffffffffffff;
  }
  uVar13 = 0xfffffbce;
  if (!bVar16) {
    uVar13 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
  }
  iVar9 = (int)this;
  bVar16 = iVar9 < 0x15 && (int)uVar13 < 0x15;
  if (iVar9 >= 0x15 || (int)uVar13 >= 0x15) {
    return bVar16;
  }
  *puVar6 = 0;
  decimal_point_00 = (int *)CONCAT44(iVar9,in_EAX);
  bVar5 = (byte)uVar13;
  if ((int)uVar13 < 0xc) {
    if (-1 < (int)uVar13) {
      buffer_00._8_8_ = puVar6;
      FillDigits64(uVar15 << (bVar5 & 0x3f),buffer_00,(int *)(ulong)uVar13);
      uVar13 = *puVar6;
      goto LAB_003de31c;
    }
    if (uVar13 < 0xffffffcc) {
      if (0xffffff7f < uVar13) {
        *length = 0;
        goto LAB_003de44a;
      }
      *buffer_00.start_ = '\0';
      *puVar6 = 0;
      *length = -iVar9;
    }
    else {
      bVar5 = -bVar5;
      piVar7 = (int *)(ulong)CONCAT31((int3)(uVar13 >> 8),bVar5);
      uVar14 = uVar15 >> (bVar5 & 0x3f);
      uVar15 = uVar15 - (uVar14 << (bVar5 & 0x3f));
      if (uVar14 >> 0x20 == 0) {
        buffer_03._8_8_ = puVar6;
        buffer_03.start_ = buffer_00.start_;
        FillDigits32((uint32_t)uVar14,buffer_03,piVar7);
      }
      else {
        buffer_02._8_8_ = puVar6;
        buffer_02.start_ = buffer_00.start_;
        FillDigits64(uVar14,buffer_02,piVar7);
      }
      *length = *puVar6;
      iVar9 = (int)((ulong)decimal_point_00 >> 0x20);
LAB_003de44a:
      buffer_04._8_8_ = puVar6;
      buffer_04.start_ = buffer_00.start_;
      FillFractionals(uVar15,uVar13,iVar9,buffer_04,length,decimal_point_00);
    }
  }
  else {
    if (uVar13 < 0x12) {
      uVar10 = 0xb1a2bc2ec5 << (0x11 - bVar5 & 0x3f);
      uVar14 = uVar15 / uVar10;
      piVar7 = (int *)(ulong)uVar13;
      uVar15 = uVar15 % uVar10 << (bVar5 & 0x3f);
    }
    else {
      uVar15 = uVar15 << (bVar5 - 0x11 & 0x3f);
      piVar7 = (int *)0x5c3bd5191b525a25;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar15;
      uVar14 = SUB168(auVar1 * ZEXT816(0x5c3bd5191b525a25),8) >> 0x26;
      uVar15 = (uVar15 + uVar14 * -0xb1a2bc2ec5) * 0x20000;
    }
    buffer_01._8_8_ = puVar6;
    buffer_01.start_ = buffer_00.start_;
    FillDigits32((uint32_t)uVar14,buffer_01,piVar7);
    pcVar3 = buffer_00.start_ + 2;
    uVar13 = 4;
    uVar14 = uVar15 / 100000000000000;
    do {
      pcVar3[(int)*puVar6] = (char)uVar14 + (char)(uVar14 / 10) * -10 | 0x30;
      uVar13 = uVar13 - 1;
      pcVar3 = pcVar3 + -1;
      uVar14 = uVar14 / 10;
    } while (1 < uVar13);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar15 / 10000000;
    *puVar6 = *puVar6 + 3;
    uVar13 = (int)(uVar15 / 10000000) + SUB164(auVar2 * ZEXT816(0x1ad7f29abcb),8) * -10000000;
    pcVar3 = buffer_00.start_ + 6;
    uVar8 = 8;
    do {
      pcVar3[(int)*puVar6] = (char)uVar13 + (char)(uVar13 / 10) * -10 | 0x30;
      uVar8 = uVar8 - 1;
      pcVar3 = pcVar3 + -1;
      uVar13 = uVar13 / 10;
    } while (1 < uVar8);
    *puVar6 = *puVar6 + 7;
    pcVar3 = buffer_00.start_ + 6;
    uVar13 = 8;
    uVar15 = uVar15 % 10000000;
    do {
      pcVar3[(int)*puVar6] = (char)uVar15 + (char)(uVar15 / 10) * -10 | 0x30;
      uVar13 = uVar13 - 1;
      pcVar3 = pcVar3 + -1;
      uVar15 = uVar15 / 10;
    } while (1 < uVar13);
    uVar13 = *puVar6 + 7;
    *puVar6 = uVar13;
LAB_003de31c:
    *length = uVar13;
  }
  uVar13 = *puVar6;
  uVar15 = (ulong)(int)uVar13;
  if ((long)uVar15 < 1) goto LAB_003de3dc;
  uVar14 = uVar15;
  if (buffer_00.start_[uVar15 - 1] == '0') {
    do {
      *puVar6 = (int)uVar14 - 1;
      if (uVar14 < 2) {
        uVar13 = (int)uVar14 - 1;
        goto LAB_003de3dc;
      }
      uVar15 = uVar14 - 1;
      lVar4 = uVar14 - 2;
      uVar14 = uVar15;
    } while (buffer_00.start_[lVar4] == '0');
    if (0 < (long)uVar15) goto LAB_003de364;
  }
  else {
    uVar14 = (ulong)uVar13;
LAB_003de364:
    uVar13 = (uint)uVar14;
    uVar10 = 0;
    do {
      uVar11 = uVar10;
      if (buffer_00.start_[uVar10] != '0') break;
      uVar10 = uVar10 + 1;
      uVar11 = uVar15;
    } while (uVar15 != uVar10);
    iVar9 = (int)uVar11;
    if (iVar9 != 0) {
      if (iVar9 < (int)uVar13) {
        lVar4 = (long)iVar9;
        lVar12 = 0;
        do {
          buffer_00.start_[lVar12] = buffer_00.start_[lVar4];
          lVar4 = lVar4 + 1;
          uVar13 = *puVar6;
          lVar12 = lVar12 + 1;
        } while (lVar4 < (int)uVar13);
      }
      *puVar6 = uVar13 - iVar9;
      *length = *length - iVar9;
      uVar13 = *puVar6;
      goto LAB_003de3dc;
    }
  }
  uVar13 = (uint)uVar14;
LAB_003de3dc:
  buffer_00.start_[(int)uVar13] = '\0';
  if (*puVar6 == 0) {
    *length = -(int)((ulong)decimal_point_00 >> 0x20);
  }
  return bVar16;
}

Assistant:

bool FastFixedDtoa(double v,
                   int fractional_count,
                   Vector<char> buffer,
                   int* length,
                   int* decimal_point) {
  const uint32_t kMaxUInt32 = 0xFFFFFFFF;
  uint64_t significand = Double(v).Significand();
  int exponent = Double(v).Exponent();
  // v = significand * 2^exponent (with significand a 53bit integer).
  // If the exponent is larger than 20 (i.e. we may have a 73bit number) then we
  // don't know how to compute the representation. 2^73 ~= 9.5*10^21.
  // If necessary this limit could probably be increased, but we don't need
  // more.
  if (exponent > 20) return false;
  if (fractional_count > 20) return false;
  *length = 0;
  // At most kDoubleSignificandSize bits of the significand are non-zero.
  // Given a 64 bit integer we have 11 0s followed by 53 potentially non-zero
  // bits:  0..11*..0xxx..53*..xx
  if (exponent + kDoubleSignificandSize > 64) {
    // The exponent must be > 11.
    //
    // We know that v = significand * 2^exponent.
    // And the exponent > 11.
    // We simplify the task by dividing v by 10^17.
    // The quotient delivers the first digits, and the remainder fits into a 64
    // bit number.
    // Dividing by 10^17 is equivalent to dividing by 5^17*2^17.
    const uint64_t kFive17 = DOUBLE_CONVERSION_UINT64_2PART_C(0xB1, A2BC2EC5);  // 5^17
    uint64_t divisor = kFive17;
    int divisor_power = 17;
    uint64_t dividend = significand;
    uint32_t quotient;
    uint64_t remainder;
    // Let v = f * 2^e with f == significand and e == exponent.
    // Then need q (quotient) and r (remainder) as follows:
    //   v            = q * 10^17       + r
    //   f * 2^e      = q * 10^17       + r
    //   f * 2^e      = q * 5^17 * 2^17 + r
    // If e > 17 then
    //   f * 2^(e-17) = q * 5^17        + r/2^17
    // else
    //   f  = q * 5^17 * 2^(17-e) + r/2^e
    if (exponent > divisor_power) {
      // We only allow exponents of up to 20 and therefore (17 - e) <= 3
      dividend <<= exponent - divisor_power;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << divisor_power;
    } else {
      divisor <<= divisor_power - exponent;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << exponent;
    }
    FillDigits32(quotient, buffer, length);
    FillDigits64FixedLength(remainder, buffer, length);
    *decimal_point = *length;
  } else if (exponent >= 0) {
    // 0 <= exponent <= 11
    significand <<= exponent;
    FillDigits64(significand, buffer, length);
    *decimal_point = *length;
  } else if (exponent > -kDoubleSignificandSize) {
    // We have to cut the number.
    uint64_t integrals = significand >> -exponent;
    uint64_t fractionals = significand - (integrals << -exponent);
    if (integrals > kMaxUInt32) {
      FillDigits64(integrals, buffer, length);
    } else {
      FillDigits32(static_cast<uint32_t>(integrals), buffer, length);
    }
    *decimal_point = *length;
    FillFractionals(fractionals, exponent, fractional_count,
                    buffer, length, decimal_point);
  } else if (exponent < -128) {
    // This configuration (with at most 20 digits) means that all digits must be
    // 0.
    DOUBLE_CONVERSION_ASSERT(fractional_count <= 20);
    buffer[0] = '\0';
    *length = 0;
    *decimal_point = -fractional_count;
  } else {
    *decimal_point = 0;
    FillFractionals(significand, exponent, fractional_count,
                    buffer, length, decimal_point);
  }
  TrimZeros(buffer, length, decimal_point);
  buffer[*length] = '\0';
  if ((*length) == 0) {
    // The string is empty and the decimal_point thus has no importance. Mimic
    // Gay's dtoa and set it to -fractional_count.
    *decimal_point = -fractional_count;
  }
  return true;
}